

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall Lexer::Lexer(Lexer *this,string *input)

{
  pointer pcVar1;
  
  (this->m_input)._M_dataplus._M_p = (pointer)&(this->m_input).field_2;
  pcVar1 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + input->_M_string_length);
  (this->m_iter)._M_current = (input->_M_dataplus)._M_p;
  this->m_line = 1;
  return;
}

Assistant:

Lexer::Lexer(const std::string& input)
    : m_input(input)
    , m_iter(input.cbegin())
    , m_line(1)
{

}